

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockNodeTreeUpdateSplitter(ImGuiDockNode *node)

{
  ImVec2 *this;
  ImVec2 *this_00;
  undefined1 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiAxis axis;
  ImGuiDockNode *node_00;
  ImGuiDockNode *node_01;
  ImDrawList *this_01;
  ImGuiDockNode *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  uint uVar8;
  ImU32 IVar9;
  ImGuiID IVar10;
  float *pfVar11;
  ImGuiDockNode **ppIVar12;
  int side_n;
  long lVar13;
  int touching_node_n_1;
  size_t idx;
  int touching_node_n;
  int iVar14;
  float fVar15;
  float local_b8;
  float cur_size_1;
  ImGuiContext *local_a8;
  float local_9c;
  float cur_size_0;
  undefined1 auStack_94 [12];
  ImVec2 IStack_90;
  ImVector<ImGuiDockNode_*> touching_nodes [2];
  ImRect local_40;
  
  node_00 = node->ChildNodes[0];
  if (node_00 == (ImGuiDockNode *)0x0) {
    return;
  }
  node_01 = node->ChildNodes[1];
  if ((node_00->field_0xc5 & 2) != 0) {
    if ((node_01->field_0xc5 & 2) != 0) {
      axis = node->SplitAxis;
      idx = (size_t)axis;
      if (idx == 0xffffffffffffffff) {
        __assert_fail("axis != ImGuiAxis_None",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                      ,0x3edd,"void ImGui::DockNodeTreeUpdateSplitter(ImGuiDockNode *)");
      }
      local_a8 = GImGui;
      local_40.Min = node_00->Pos;
      local_40.Max = node_01->Pos;
      this = &node_00->Size;
      pfVar11 = ImVec2::operator[](this,idx);
      fVar2 = *pfVar11;
      pfVar11 = ImVec2::operator[](&local_40.Min,idx);
      *pfVar11 = fVar2 + *pfVar11;
      this_00 = &node_01->Size;
      pfVar11 = ImVec2::operator[](this_00,(long)(axis ^ ImGuiAxis_Y));
      fVar2 = *pfVar11;
      pfVar11 = ImVec2::operator[](&local_40.Max,(long)(axis ^ ImGuiAxis_Y));
      pIVar6 = local_a8;
      *pfVar11 = fVar2 + *pfVar11;
      uVar8 = node_01->MergedFlags | node_00->MergedFlags;
      if (((uVar8 & 0x20) == 0) &&
         ((uVar8 & (uint)(axis != ImGuiAxis_X) * 0x400000 + 0x400000) == 0)) {
        PushID(node->ID);
        pIVar6 = local_a8;
        touching_nodes[1].Size = 0;
        touching_nodes[1].Capacity = 0;
        touching_nodes[1].Data = (ImGuiDockNode **)0x0;
        touching_nodes[0].Size = 0;
        touching_nodes[0].Capacity = 0;
        touching_nodes[0].Data = (ImGuiDockNode **)0x0;
        pfVar11 = ImVec2::operator[](&(local_a8->Style).WindowMinSize,idx);
        fVar2 = *pfVar11;
        pfVar11 = ImVec2::operator[](&node->ChildNodes[0]->Pos,idx);
        fVar15 = *pfVar11 + fVar2;
        pfVar11 = ImVec2::operator[](&node->ChildNodes[1]->Pos,idx);
        fVar3 = *pfVar11;
        pfVar11 = ImVec2::operator[](&node->ChildNodes[1]->Size,idx);
        fVar4 = *pfVar11;
        IVar10 = GetID("##Splitter");
        local_b8 = (fVar3 + fVar4) - fVar2;
        if (pIVar6->ActiveId == IVar10) {
          DockNodeTreeUpdateSplitterFindTouchingNode(node_00,axis,1,touching_nodes);
          DockNodeTreeUpdateSplitterFindTouchingNode(node_01,axis,0,touching_nodes + 1);
          for (iVar14 = 0; iVar14 < touching_nodes[0].Size; iVar14 = iVar14 + 1) {
            ppIVar12 = ImVector<ImGuiDockNode_*>::operator[](touching_nodes,iVar14);
            _cur_size_0 = ImGuiDockNode::Rect(*ppIVar12);
            pfVar11 = ImVec2::operator[]((ImVec2 *)&cur_size_0,idx);
            uVar8 = -(uint)(*pfVar11 + fVar2 <= fVar15);
            fVar15 = (float)(uVar8 & (uint)fVar15 | ~uVar8 & (uint)(*pfVar11 + fVar2));
          }
          for (iVar14 = 0; iVar14 < touching_nodes[1].Size; iVar14 = iVar14 + 1) {
            ppIVar12 = ImVector<ImGuiDockNode_*>::operator[](touching_nodes + 1,iVar14);
            _cur_size_0 = ImGuiDockNode::Rect(*ppIVar12);
            pfVar11 = ImVec2::operator[](&IStack_90,idx);
            if (*pfVar11 - fVar2 <= local_b8) {
              local_b8 = *pfVar11 - fVar2;
            }
          }
        }
        pfVar11 = ImVec2::operator[](this,idx);
        cur_size_0 = *pfVar11;
        pfVar11 = ImVec2::operator[](this_00,idx);
        cur_size_1 = *pfVar11;
        pfVar11 = ImVec2::operator[](&node_00->Pos,idx);
        local_a8 = (ImGuiContext *)CONCAT44(local_a8._4_4_,*pfVar11);
        pfVar11 = ImVec2::operator[](&node_01->Pos,idx);
        fVar2 = *pfVar11;
        pfVar11 = ImVec2::operator[](this_00,idx);
        local_9c = *pfVar11;
        IVar9 = GetColorU32(2,1.0);
        IVar10 = GetID("##Splitter");
        bVar7 = SplitterBehavior(&local_40,IVar10,axis,&cur_size_0,&cur_size_1,
                                 fVar15 - local_a8._0_4_,(fVar2 + local_9c) - local_b8,4.0,0.04,
                                 IVar9);
        if (((bVar7) && (0 < touching_nodes[0].Size)) && (0 < touching_nodes[1].Size)) {
          fVar2 = cur_size_0;
          pfVar11 = ImVec2::operator[](&node_00->SizeRef,idx);
          *pfVar11 = fVar2;
          pfVar11 = ImVec2::operator[](this,idx);
          fVar3 = cur_size_1;
          *pfVar11 = fVar2;
          pfVar11 = ImVec2::operator[](this_00,idx);
          fVar2 = *pfVar11;
          pfVar11 = ImVec2::operator[](&node_01->Pos,idx);
          fVar4 = cur_size_1;
          *pfVar11 = *pfVar11 - (fVar3 - fVar2);
          pfVar11 = ImVec2::operator[](&node_01->SizeRef,idx);
          *pfVar11 = fVar4;
          pfVar11 = ImVec2::operator[](this_00,idx);
          *pfVar11 = fVar4;
          for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
            for (iVar14 = 0; iVar14 < touching_nodes[lVar13].Size; iVar14 = iVar14 + 1) {
              ppIVar12 = ImVector<ImGuiDockNode_*>::operator[](touching_nodes + lVar13,iVar14);
              while( true ) {
                pIVar5 = (*ppIVar12)->ParentNode;
                if (pIVar5 == node) break;
                ppIVar12 = &(*ppIVar12)->ParentNode;
                if (pIVar5->SplitAxis == axis) {
                  puVar1 = &pIVar5->ChildNodes[lVar13]->field_0xc6;
                  *puVar1 = *puVar1 | 1;
                }
              }
            }
          }
          DockNodeTreeUpdatePosSize(node_00,node_00->Pos,node_00->Size,(ImGuiDockNode *)0x0);
          DockNodeTreeUpdatePosSize(node_01,node_01->Pos,node_01->Size,(ImGuiDockNode *)0x0);
          if (GImGui->SettingsDirtyTimer <= 0.0) {
            GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
          }
        }
        PopID();
        lVar13 = 0x10;
        do {
          ImVector<ImGuiDockNode_*>::~ImVector
                    ((ImVector<ImGuiDockNode_*> *)((long)&touching_nodes[0].Size + lVar13));
          lVar13 = lVar13 + -0x10;
        } while (lVar13 != -0x10);
      }
      else {
        this_01 = local_a8->CurrentWindow->DrawList;
        IVar9 = GetColorU32(0x1b,1.0);
        ImDrawList::AddRectFilled
                  (this_01,&local_40.Min,&local_40.Max,IVar9,(pIVar6->Style).FrameRounding,0);
      }
      if ((node_00->field_0xc5 & 2) == 0) goto LAB_00163c06;
    }
    DockNodeTreeUpdateSplitter(node_00);
  }
LAB_00163c06:
  if ((node_01->field_0xc5 & 2) != 0) {
    DockNodeTreeUpdateSplitter(node_01);
  }
  return;
}

Assistant:

void ImTriangleBarycentricCoords(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& p, float& out_u, float& out_v, float& out_w)
{
    ImVec2 v0 = b - a;
    ImVec2 v1 = c - a;
    ImVec2 v2 = p - a;
    const float denom = v0.x * v1.y - v1.x * v0.y;
    out_v = (v2.x * v1.y - v1.x * v2.y) / denom;
    out_w = (v0.x * v2.y - v2.x * v0.y) / denom;
    out_u = 1.0f - out_v - out_w;
}